

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O2

SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
absl::lts_20250127::strings_internal::
SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
::operator++(SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *this)

{
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *pSVar1;
  size_t sVar2;
  char *pcVar3;
  string_view sVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  string_view text;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  if (this->state_ == kLastState) {
    this->state_ = kEndState;
  }
  else {
    pSVar1 = this->splitter_;
    sVar2 = (pSVar1->text_)._M_len;
    pcVar3 = (pSVar1->text_)._M_str;
    sVar4._M_len = (pSVar1->text_)._M_len;
    sVar4._M_str = (pSVar1->text_)._M_str;
    local_30._M_len = sVar2;
    local_30._M_str = pcVar3;
    sVar4 = ByChar::Find(&this->delimiter_,sVar4,this->pos_);
    if (sVar4._M_str == pcVar3 + sVar2) {
      this->state_ = kLastState;
    }
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_30,this->pos_,(long)sVar4._M_str - (long)(pcVar3 + this->pos_));
    (this->curr_)._M_len = bVar5._M_len;
    (this->curr_)._M_str = bVar5._M_str;
    this->pos_ = this->pos_ + sVar4._M_len + bVar5._M_len;
  }
  return this;
}

Assistant:

SplitIterator& operator++() {
    do {
      if (state_ == kLastState) {
        state_ = kEndState;
        return *this;
      }
      const absl::string_view text = splitter_->text();
      const absl::string_view d = delimiter_.Find(text, pos_);
      if (d.data() == text.data() + text.size()) state_ = kLastState;
      curr_ = text.substr(pos_,
                          static_cast<size_t>(d.data() - (text.data() + pos_)));
      pos_ += curr_.size() + d.size();
    } while (!predicate_(curr_));
    return *this;
  }